

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_group_finish_xml
               (char *group_name,size_t total_executed,size_t total_failed,size_t total_errors,
               size_t total_skipped,double total_runtime,CMUnitTestState *cm_tests)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_t in_RCX;
  char *in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  char *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  bool bVar4;
  char *in_XMM0_Qa;
  CMUnitTestState *cmtest;
  int rc;
  size_t i;
  char *env;
  int file_opened;
  FILE *fp;
  int multiple_files;
  char buf [1024];
  ulong local_468;
  FILE *local_450;
  int *piVar5;
  undefined4 uVar6;
  char local_408 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_450 = _stdout;
  bVar4 = false;
  pcVar3 = getenv("CMOCKA_XML_FILE");
  if (pcVar3 != (char *)0x0) {
    snprintf(local_408,0x400,"%s",pcVar3);
    iVar2 = c_strreplace(in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9);
    if (iVar2 < 0) {
      snprintf(local_408,0x400,"%s",pcVar3);
    }
    __stream = fopen(local_408,"r");
    if (__stream == (FILE *)0x0) {
      local_450 = fopen(local_408,"w");
      bVar4 = local_450 == (FILE *)0x0;
      if (bVar4) {
        local_450 = _stderr;
      }
      else {
        file_append = 1;
      }
      bVar4 = !bVar4;
    }
    else {
      fclose(__stream);
      if (file_append == 0) {
        local_450 = _stderr;
      }
      else {
        local_450 = fopen(local_408,"a");
        bVar4 = local_450 == (FILE *)0x0;
        if (bVar4) {
          local_450 = _stderr;
        }
        else {
          xml_printed = 1;
        }
        bVar4 = !bVar4;
      }
    }
  }
  uVar6 = SUB84(in_R8,0);
  if (((xml_printed == 0) || ((bVar4 && (file_append == 0)))) &&
     (fprintf(local_450,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n"), !bVar4)) {
    xml_printed = 1;
  }
  fprintf(local_450,"<testsuites>\n");
  fprintf(local_450,
          "  <testsuite name=\"%s\" time=\"%.3f\" tests=\"%u\" failures=\"%u\" errors=\"%u\" skipped=\"%u\" >\n"
          ,in_XMM0_Qa,in_RDI,in_RSI & 0xffffffff,(ulong)in_RDX & 0xffffffff,in_RCX & 0xffffffff,
          uVar6);
  for (local_468 = 0; local_468 < in_RSI; local_468 = local_468 + 1) {
    piVar5 = in_R9;
    fprintf(local_450,"    <testcase name=\"%s\" time=\"%.3f\" >\n",
            *(undefined8 *)(in_R9 + local_468 * 0xc + 10),
            **(undefined8 **)(in_R9 + local_468 * 0xc + 2));
    uVar1 = in_R9[local_468 * 0xc + 8];
    if (1 < uVar1) {
      if (uVar1 - 2 < 2) {
        if (*(long *)(in_R9 + local_468 * 0xc + 6) == 0) {
          fprintf(local_450,"      <failure message=\"Unknown error\" />\n");
        }
        else {
          fprintf(local_450,"      <failure><![CDATA[%s]]></failure>\n",
                  *(undefined8 *)(in_R9 + local_468 * 0xc + 6));
        }
      }
      else if (uVar1 == 4) {
        fprintf(local_450,"      <skipped/>\n");
      }
    }
    fprintf(local_450,"    </testcase>\n");
    in_R9 = piVar5;
  }
  fprintf(local_450,"  </testsuite>\n");
  fprintf(local_450,"</testsuites>\n");
  if (bVar4) {
    fclose(local_450);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cmprintf_group_finish_xml(const char *group_name,
                                      size_t total_executed,
                                      size_t total_failed,
                                      size_t total_errors,
                                      size_t total_skipped,
                                      double total_runtime,
                                      struct CMUnitTestState *cm_tests)
{
    FILE *fp = stdout;
    int file_opened = 0;
    int multiple_files = 0;
    char *env;
    size_t i;

    env = getenv("CMOCKA_XML_FILE");
    if (env != NULL) {
        char buf[1024];
        int rc;

        snprintf(buf, sizeof(buf), "%s", env);

        rc = c_strreplace(buf, sizeof(buf), "%g", group_name, &multiple_files);
        if (rc < 0) {
            snprintf(buf, sizeof(buf), "%s", env);
        }

        fp = fopen(buf, "r");
        if (fp == NULL) {
            fp = fopen(buf, "w");
            if (fp != NULL) {
                file_append = 1;
                file_opened = 1;
            } else {
                fp = stderr;
            }
        } else {
            fclose(fp);
            if (file_append) {
                fp = fopen(buf, "a");
                if (fp != NULL) {
                    file_opened = 1;
                    xml_printed = 1;
                } else {
                    fp = stderr;
                }
            } else {
                fp = stderr;
            }
        }
    }

    if (!xml_printed || (file_opened && !file_append)) {
        fprintf(fp, "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n");
        if (!file_opened) {
            xml_printed = 1;
        }
    }

    fprintf(fp, "<testsuites>\n");
    fprintf(fp, "  <testsuite name=\"%s\" time=\"%.3f\" "
                "tests=\"%u\" failures=\"%u\" errors=\"%u\" skipped=\"%u\" >\n",
                group_name,
                total_runtime, /* seconds */
                (unsigned)total_executed,
                (unsigned)total_failed,
                (unsigned)total_errors,
                (unsigned)total_skipped);

    for (i = 0; i < total_executed; i++) {
        struct CMUnitTestState *cmtest = &cm_tests[i];

        fprintf(fp, "    <testcase name=\"%s\" time=\"%.3f\" >\n",
                cmtest->test->name, cmtest->runtime);

        switch (cmtest->status) {
        case CM_TEST_ERROR:
        case CM_TEST_FAILED:
            if (cmtest->error_message != NULL) {
                fprintf(fp, "      <failure><![CDATA[%s]]></failure>\n",
                        cmtest->error_message);
            } else {
                fprintf(fp, "      <failure message=\"Unknown error\" />\n");
            }
            break;
        case CM_TEST_SKIPPED:
            fprintf(fp, "      <skipped/>\n");
            break;

        case CM_TEST_PASSED:
        case CM_TEST_NOT_STARTED:
            break;
        }

        fprintf(fp, "    </testcase>\n");
    }

    fprintf(fp, "  </testsuite>\n");
    fprintf(fp, "</testsuites>\n");

    if (file_opened) {
        fclose(fp);
    }
}